

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall argo::lexer::consume_white_space(lexer *this)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar1;
  undefined8 extraout_RDX;
  
  do {
    uVar1 = (*this->m_reader->_vptr_reader[2])();
    if (0x20 < uVar1) break;
  } while ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) != 0);
  UNRECOVERED_JUMPTABLE = this->m_reader->_vptr_reader[3];
  (*UNRECOVERED_JUMPTABLE)(this->m_reader,(ulong)uVar1,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void lexer::consume_white_space()
{
    while (true)
    {
        int c = m_reader.next();

        if ((c == 0x20) || (c == 0x09) || (c == 0x0A) || (c == 0x0D))
        {
            continue;
        }
        else
        {
            m_reader.put_back(c);
            return;
        }
    }
}